

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObject::AllocateSharedDataItems
          (CSharedMemoryObject *this,SHMPTR *pshmObjData,SHMObjData **ppsmod)

{
  DWORD DVar1;
  bool bVar2;
  SHMPTR shmptr;
  SHMObjData *__s;
  SHMPTR SVar3;
  PAL_ERROR PVar4;
  ulong uVar5;
  
  if (pshmObjData == (SHMPTR *)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateSharedDataItems",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x134);
    fprintf(_stderr,"Expression: NULL != pshmObjData\n");
  }
  if (ppsmod == (SHMObjData **)0x0) {
    fprintf(_stderr,"] %s %s:%d","AllocateSharedDataItems",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x135);
    fprintf(_stderr,"Expression: NULL != ppsmod\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c722b;
  SHMLock();
  shmptr = SHMalloc(0x48);
  if (shmptr == 0) {
LAB_002c71ec:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c722b;
    PVar4 = 0xe;
    bVar2 = true;
  }
  else {
    __s = (SHMObjData *)SHMPtrToPtr(shmptr);
    if (__s == (SHMObjData *)0x0) {
      fprintf(_stderr,"] %s %s:%d","AllocateSharedDataItems",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
              ,0x14e);
      fprintf(_stderr,"Expression: NULL != psmod\n");
    }
    memset(__s,0,0x48);
    __s->eTypeId = ((this->super_CPalObjectBase).m_pot)->m_eTypeId;
    __s->lProcessRefCount = 1;
    DVar1 = (this->super_CPalObjectBase).m_oa.sObjectName.m_dwStringLength;
    if (DVar1 != 0) {
      __s->dwNameLength = DVar1;
      SVar3 = SHMWStrDup((this->super_CPalObjectBase).m_oa.sObjectName.m_pwsz);
      __s->shmObjName = SVar3;
      if (SVar3 == 0) goto LAB_002c71ec;
    }
    uVar5 = (ulong)((this->super_CPalObjectBase).m_pot)->m_dwImmutableDataSize;
    if (uVar5 != 0) {
      SVar3 = SHMalloc(uVar5);
      __s->shmObjImmutableData = SVar3;
      if (SVar3 == 0) goto LAB_002c71ec;
    }
    uVar5 = (ulong)((this->super_CPalObjectBase).m_pot)->m_dwSharedDataSize;
    if (uVar5 != 0) {
      SVar3 = SHMalloc(uVar5);
      __s->shmObjSharedData = SVar3;
      if (SVar3 == 0) goto LAB_002c71ec;
    }
    *pshmObjData = shmptr;
    *ppsmod = __s;
    bVar2 = false;
    PVar4 = 0;
  }
  if (bVar2 && shmptr != 0) {
    FreeSharedDataAreas(shmptr);
  }
  SHMRelease();
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar4;
  }
LAB_002c722b:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObject::AllocateSharedDataItems(
    SHMPTR *pshmObjData,
    SHMObjData **ppsmod
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMPTR shmod = SHMNULL;
    SHMObjData *psmod = NULL;

    _ASSERTE(NULL != pshmObjData);
    _ASSERTE(NULL != ppsmod);

    ENTRY("CSharedMemoryObject::AllocateSharedDataItems"
        "(this = %p, pshmObjData = %p, ppsmod = %p)\n",
        this,
        pshmObjData,
        ppsmod
        );
        
    //
    // We're about to make a number of shared memory allocations,
    // so grab the lock for the entirety of the routine.
    //

    SHMLock();

    shmod = SHMalloc(sizeof(SHMObjData));
    if (SHMNULL == shmod)
    {
        ERROR("Unable to allocate m_shmod for new object\n");
        palError = ERROR_OUTOFMEMORY;
        goto AllocateSharedDataItemsExit;
    }

    psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, shmod);
    _ASSERTE(NULL != psmod);

    ZeroMemory(psmod, sizeof(*psmod));

    psmod->eTypeId = m_pot->GetId();
    psmod->lProcessRefCount = 1;

    if (0 != m_oa.sObjectName.GetStringLength())
    {
        psmod->dwNameLength = m_oa.sObjectName.GetStringLength();
        psmod->shmObjName = SHMWStrDup(m_oa.sObjectName.GetString());
        if (SHMNULL == psmod->shmObjName)
        {
            ERROR("Unable to allocate psmod->shmObjName for new object\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateSharedDataItemsExit;
        }
    }

    if (0 != m_pot->GetImmutableDataSize())
    {
        //
        // The shared copy of the object's immutable data will be initialized
        // by CSharedMemoryObjectManager::RegisterObject or PromoteSharedData
        //
        
        psmod->shmObjImmutableData = SHMalloc(m_pot->GetImmutableDataSize());
        if (SHMNULL == psmod->shmObjImmutableData)
        {
            ERROR("Unable to allocate psmod->shmObjImmutableData for new object\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateSharedDataItemsExit;
        }
    }

    if (0 != m_pot->GetSharedDataSize())
    {
        psmod->shmObjSharedData = SHMalloc(m_pot->GetSharedDataSize());
        if (SHMNULL == psmod->shmObjSharedData)
        {
            ERROR("Unable to allocate psmod->shmObjSharedData for new object\n");
            palError = ERROR_OUTOFMEMORY;
            goto AllocateSharedDataItemsExit;
        }
    }

    *pshmObjData = shmod;
    *ppsmod = psmod;

AllocateSharedDataItemsExit:

    if (NO_ERROR != palError && SHMNULL != shmod)
    {
        FreeSharedDataAreas(shmod);
    }

    SHMRelease();

    LOGEXIT("CSharedMemoryObject::AllocateSharedDataItems returns %d\n", palError);

    return palError;
}